

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::InitializePostGlobal(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  DebugContext *pDVar3;
  ProbeContainer *this_00;
  undefined4 *puVar4;
  Recycler *pRVar5;
  BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar6;
  CriticalSection *cs;
  HeapAllocator *pHVar7;
  InterpreterThunkEmitter *pIVar8;
  ArenaAllocator *pAVar9;
  ThreadContext *pTVar10;
  InProcCodePageAllocators *pIVar11;
  Profiler *profiler;
  Profiler *backgroundProfiler;
  TrackAllocData local_108;
  code *local_d0;
  undefined8 local_c8;
  TrackAllocData local_c0;
  code *local_98;
  undefined8 local_90;
  TrackAllocData local_88;
  AutoCriticalSection local_50;
  AutoCriticalSection critSec;
  TrackAllocData local_38;
  ScriptContext *local_10;
  ScriptContext *this_local;
  
  local_10 = this;
  pDVar3 = GetDebugContext(this);
  DebugContext::Initialize(pDVar3);
  pDVar3 = GetDebugContext(this);
  this_00 = DebugContext::GetProbeContainer(pDVar3);
  Js::ProbeContainer::Initialize(this_00,this);
  this->isDebugContextInitialized = true;
  if (this->CurrentThunk != InterpreterStackFrame::DelayDynamicInterpreterThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x53f,
                                "(this->CurrentThunk == Js::InterpreterStackFrame::DelayDynamicInterpreterThunk)"
                                ,"Creating non default thunk while initializing");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->DeferredParsingThunk != JavascriptFunction::DeferredParsingThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x540,
                                "(this->DeferredParsingThunk == Js::JavascriptFunction::DeferredParsingThunk)"
                                ,"Creating non default thunk while initializing");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->DeferredDeserializationThunk != JavascriptFunction::DeferredDeserializeThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x541,
                                "(this->DeferredDeserializationThunk == Js::JavascriptFunction::DeferredDeserializeThunk)"
                                ,"Creating non default thunk while initializing");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = this->recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,
             (type_info *)
             &JsUtil::
              BaseDictionary<unsigned_int,Js::ScriptContext::FieldAccessStatsEntry*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x544);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_38);
  critSec.cs = (CriticalSection *)Memory::Recycler::AllocInlined;
  this_01 = (BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar5,0x43c4b0);
  JsUtil::
  BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_01,this->recycler,0);
  this->fieldAccessStatsByFunctionNumber = this_01;
  BindReference(this,this->fieldAccessStatsByFunctionNumber);
  pLVar6 = Memory::RecyclerRootPtr::operator_cast_to_List_((RecyclerRootPtr *)&this->sourceList);
  if (pLVar6 == (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                 *)0x0) {
    cs = ThreadContext::GetFunctionBodyLock(this->threadContext);
    AutoCriticalSection::AutoCriticalSection(&local_50,cs);
    pRVar5 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,
               (type_info *)
               &JsUtil::
                List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>*,Memory::Recycler,false,Js::FreeListedRemovePolicy,DefaultComparer>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0x54b);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_88);
    local_98 = Memory::Recycler::AllocInlined;
    local_90 = 0;
    pLVar6 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
              *)new<Memory::Recycler>(0x30,pRVar5,0x43c4b0);
    pRVar5 = GetRecycler(this);
    JsUtil::
    List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
    ::List(pLVar6,pRVar5,4);
    pRVar5 = GetRecycler(this);
    Memory::
    RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
    ::Root(&this->sourceList,pLVar6,pRVar5);
    AutoCriticalSection::~AutoCriticalSection(&local_50);
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_c0,(type_info *)&InterpreterThunkEmitter::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x54f);
  pHVar7 = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_c0);
  local_d0 = Memory::HeapAllocator::Alloc;
  local_c8 = 0;
  pIVar8 = (InterpreterThunkEmitter *)new<Memory::HeapAllocator>(0x290,pHVar7,0x350bd0);
  pAVar9 = SourceCodeAllocator(this);
  pTVar10 = GetThreadContext(this);
  pIVar11 = ThreadContext::GetThunkPageAllocators(pTVar10);
  InterpreterThunkEmitter::InterpreterThunkEmitter(pIVar8,this,pAVar9,pIVar11,false);
  this->interpreterThunkEmitter = pIVar8;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_108,(type_info *)&InterpreterThunkEmitter::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x554);
  pHVar7 = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_108);
  pIVar8 = (InterpreterThunkEmitter *)new<Memory::HeapAllocator>(0x290,pHVar7,0x350bd0);
  pAVar9 = SourceCodeAllocator(this);
  pTVar10 = GetThreadContext(this);
  pIVar11 = ThreadContext::GetThunkPageAllocators(pTVar10);
  InterpreterThunkEmitter::InterpreterThunkEmitter(pIVar8,this,pAVar9,pIVar11,true);
  this->asmJsInterpreterThunkEmitter = pIVar8;
  if (this->profiler != (ScriptContextProfiler *)0x0) {
    pRVar5 = ThreadContext::GetRecycler(this->threadContext);
    profiler = ScriptContextProfiler::GetProfiler(this->profiler);
    backgroundProfiler = ScriptContextProfiler::GetBackgroundRecyclerProfiler(this->profiler);
    Memory::Recycler::SetProfiler(pRVar5,profiler,backgroundProfiler);
  }
  JavascriptLibrary::DumpLibraryByteCode((this->super_ScriptContextBase).javascriptLibrary);
  this->isInitialized = true;
  return;
}

Assistant:

void ScriptContext::InitializePostGlobal()
    {
#ifdef ENABLE_SCRIPT_DEBUGGING
        this->GetDebugContext()->Initialize();

        this->GetDebugContext()->GetProbeContainer()->Initialize(this);

        isDebugContextInitialized = true;
#endif

#if defined(_M_ARM32_OR_ARM64)
        // We need to ensure that the above write to the isDebugContextInitialized is visible to the debugger thread.
        MemoryBarrier();
#endif

        AssertMsg(this->CurrentThunk == DefaultEntryThunk, "Creating non default thunk while initializing");
        AssertMsg(this->DeferredParsingThunk == DefaultDeferredParsingThunk, "Creating non default thunk while initializing");
        AssertMsg(this->DeferredDeserializationThunk == DefaultDeferredDeserializeThunk, "Creating non default thunk while initializing");

#ifdef FIELD_ACCESS_STATS
        this->fieldAccessStatsByFunctionNumber = RecyclerNew(this->recycler, FieldAccessStatsByFunctionNumberMap, recycler);
        BindReference(this->fieldAccessStatsByFunctionNumber);
#endif

        if (!sourceList)
        {
            AutoCriticalSection critSec(threadContext->GetFunctionBodyLock());
            sourceList.Root(RecyclerNew(this->GetRecycler(), SourceList, this->GetRecycler()), this->GetRecycler());
        }

#if DYNAMIC_INTERPRETER_THUNK
        interpreterThunkEmitter = HeapNew(InterpreterThunkEmitter, this, SourceCodeAllocator(), this->GetThreadContext()->GetThunkPageAllocators());
#endif

#ifdef ASMJS_PLAT
        asmJsInterpreterThunkEmitter = HeapNew(InterpreterThunkEmitter, this, SourceCodeAllocator(), this->GetThreadContext()->GetThunkPageAllocators(),
            true);
#endif

        JS_ETW(EtwTrace::LogScriptContextLoadEvent(this));
        JS_ETW_INTERNAL(EventWriteJSCRIPT_HOST_SCRIPT_CONTEXT_START(this));

#ifdef PROFILE_EXEC
        if (profiler != nullptr)
        {
            this->threadContext->GetRecycler()->SetProfiler(profiler->GetProfiler(), profiler->GetBackgroundRecyclerProfiler());
        }
#endif

#if DBG
        this->javascriptLibrary->DumpLibraryByteCode();

        isInitialized = TRUE;
#endif
    }